

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::ProcessTriggeredEvents(CGameClient *this,int Events,vec2 Pos)

{
  long lVar1;
  uint in_ESI;
  vec2 in_RDI;
  long in_FS_OFFSET;
  CEffects *in_XMM0_Qa;
  vec2 in_stack_00000068;
  float in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  vec2 Pos_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)((long)in_RDI + 0xd24) & 1) == 0) {
    Pos_00 = in_RDI;
    if ((in_ESI & 1) != 0) {
      CSounds::PlayAt((CSounds *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),(int)in_RDI.field_1,
                      (int)in_RDI.field_0,in_stack_ffffffffffffffac,in_RDI);
    }
    if ((in_ESI & 2) != 0) {
      CEffects::AirJump(in_XMM0_Qa,in_stack_00000068);
    }
    if ((in_ESI & 4) != 0) {
      CSounds::PlayAt((CSounds *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),(int)in_RDI.field_1,
                      (int)in_RDI.field_0,in_stack_ffffffffffffffac,Pos_00);
    }
    if ((in_ESI & 8) != 0) {
      CSounds::PlayAt((CSounds *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),(int)in_RDI.field_1,
                      (int)in_RDI.field_0,in_stack_ffffffffffffffac,Pos_00);
    }
    if ((in_ESI & 0x10) != 0) {
      CSounds::PlayAt((CSounds *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),(int)in_RDI.field_1,
                      (int)in_RDI.field_0,in_stack_ffffffffffffffac,Pos_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::ProcessTriggeredEvents(int Events, vec2 Pos)
{
	if(m_SuppressEvents)
		return;

	if(Events&COREEVENTFLAG_GROUND_JUMP)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_PLAYER_JUMP, 1.0f, Pos);
	if(Events&COREEVENTFLAG_AIR_JUMP)
		m_pEffects->AirJump(Pos);
	if(Events&COREEVENTFLAG_HOOK_ATTACH_PLAYER)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HOOK_ATTACH_PLAYER, 1.0f, Pos);
	if(Events&COREEVENTFLAG_HOOK_ATTACH_GROUND)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HOOK_ATTACH_GROUND, 1.0f, Pos);
	if(Events&COREEVENTFLAG_HOOK_HIT_NOHOOK)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HOOK_NOATTACH, 1.0f, Pos);
	/*if(Events&COREEVENTFLAG_HOOK_LAUNCH)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HOOK_LOOP, 1.0f, Pos);
	if(Events&COREEVENTFLAG_HOOK_RETRACT)
		m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_PLAYER_JUMP, 1.0f, Pos);*/
}